

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client_link.cpp
# Opt level: O1

void __thiscall
miniros::ServiceClientLink::onResponseWritten(ServiceClientLink *this,ConnectionPtr *conn)

{
  Connection *this_00;
  size_t in_RCX;
  ServiceClientLink *local_28;
  undefined8 uStack_20;
  code *local_18;
  code *pcStack_10;
  
  this_00 = (this->connection_).super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this->persistent_ == true) {
    uStack_20 = 0;
    pcStack_10 = std::
                 _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_client_link.cpp:259:7)>
                 ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_client_link.cpp:259:7)>
               ::_M_manager;
    local_28 = this;
    Connection::read(this_00,4,&local_28,in_RCX);
    if (local_18 != (code *)0x0) {
      (*local_18)(&local_28,&local_28,3);
    }
    return;
  }
  Connection::drop(this_00,Destructing);
  return;
}

Assistant:

void ServiceClientLink::onResponseWritten(const ConnectionPtr& conn)
{
  (void)conn;
  MINIROS_ASSERT(conn == connection_);

  if (persistent_)
  {
    connection_->read(4,
      [this](const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
      {
        this->onRequestLength(conn, buffer, size, success);
      });
  }
  else
  {
    connection_->drop(Connection::Destructing);
  }
}